

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tri_uv_area_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_uv_area)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  bool bVar4;
  REF_STATUS RVar5;
  REF_INT cell;
  ulong uVar6;
  double dVar7;
  REF_DBL uv_area;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  *min_uv_area = -2.0;
  uVar6 = 0xffffffff;
  if (-1 < node) {
    uVar6 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar6 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar6 == -1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xf2,
           "ref_smooth_tri_uv_area_around","no triangle found, can not compute min uv area");
    RVar5 = 1;
  }
  else {
    cell = ref_cell->ref_adj->item[(int)uVar6].ref;
    bVar4 = false;
    do {
      uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xe5,"ref_smooth_tri_uv_area_around",(ulong)uVar3,"nodes");
        return uVar3;
      }
      uVar3 = ref_geom_uv_area_sign(ref_grid,local_a8[ref_cell->node_per],&local_b0);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xe7,"ref_smooth_tri_uv_area_around",(ulong)uVar3,"sign");
        return uVar3;
      }
      uVar3 = ref_geom_uv_area(ref_grid->geom,local_a8,&local_b8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xe8,"ref_smooth_tri_uv_area_around",(ulong)uVar3,"uv area");
        return uVar3;
      }
      local_b8 = local_b0 * local_b8;
      dVar7 = local_b8;
      if ((bVar4) && (dVar7 = *min_uv_area, local_b8 <= *min_uv_area)) {
        dVar7 = local_b8;
      }
      *min_uv_area = dVar7;
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)uVar6].next;
      uVar6 = (ulong)iVar1;
      if (uVar6 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar6].ref;
      }
      bVar4 = true;
    } while (iVar1 != -1);
    RVar5 = 0;
  }
  return RVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_uv_area_around(REF_GRID ref_grid,
                                                        REF_INT node,
                                                        REF_DBL *min_uv_area) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT id, item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL sign_uv_area, uv_area;

  *min_uv_area = -2.0;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_uv_area_sign(ref_grid, id, &sign_uv_area), "sign");
    RSS(ref_geom_uv_area(ref_grid_geom(ref_grid), nodes, &uv_area), "uv area");
    uv_area *= sign_uv_area;
    if (none_found) {
      *min_uv_area = uv_area;
      none_found = REF_FALSE;
    } else {
      *min_uv_area = MIN(*min_uv_area, uv_area);
    }
  }

  if (none_found) THROW("no triangle found, can not compute min uv area");

  return REF_SUCCESS;
}